

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Monthly.cpp
# Opt level: O3

bool __thiscall RenX_Ladder_Monthly_TimePlugin::initialize(RenX_Ladder_Monthly_TimePlugin *this)

{
  LadderDatabase *pLVar1;
  bool bVar2;
  undefined8 uVar3;
  const_iterator cVar4;
  tm *ptVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  time_t current_time;
  time_t local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_38 = time((time_t *)0x0);
  pLVar1 = &this->database;
  uVar3 = Jupiter::Config::get(&this->field_0x38,0xe,"LadderDatabase",0x11,"Ladder.Monthly.db");
  Jupiter::Database::process_file(pLVar1,uVar3);
  uVar3 = Jupiter::Config::get(&this->field_0x38,0xc,"DatabaseName",7,"Monthly");
  RenX::LadderDatabase::setName(pLVar1,uVar3);
  local_30._M_len = 0xb;
  local_30._M_str = "OutputTimes";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_30);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    in_string._M_str = extraout_RDX;
    in_string._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    Jupiter::asBool<char>
              (*(Jupiter **)
                ((long)cVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_cur + 0x30),in_string);
  }
  RenX::LadderDatabase::setOutputTimes(SUB81(pLVar1,0));
  ptVar5 = gmtime(&local_38);
  this->last_sorted_month = ptVar5->tm_mon;
  *(code **)&this->field_0xb8 = OnPreUpdateLadder;
  local_30._M_len = 0xc;
  local_30._M_str = "ForceDefault";
  cVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_30);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    in_string_00._M_str = extraout_RDX_00;
    in_string_00._M_len =
         *(size_t *)
          ((long)cVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar2 = Jupiter::asBool<char>
                      (*(Jupiter **)
                        ((long)cVar4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),in_string_00);
    if (bVar2) {
      RenX::default_ladder_database = pLVar1;
    }
  }
  return true;
}

Assistant:

bool RenX_Ladder_Monthly_TimePlugin::initialize() {
	time_t current_time = time(0);
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.Monthly.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "Monthly"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, false));

	this->last_sorted_month = gmtime(&current_time)->tm_mon;
	this->database.OnPreUpdateLadder = OnPreUpdateLadder;

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, false)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}